

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forced_max_frame_width_height_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_169c9a6::EncodeForcedMaxFrameWidthHeight_SecondFrameTooBig_Test::TestBody
          (EncodeForcedMaxFrameWidthHeight_SecondFrameTooBig_Test *this)

{
  undefined8 uVar1;
  aom_codec_err_t aVar2;
  aom_codec_iface_t *iface;
  undefined8 *puVar3;
  SEARCH_METHODS *pSVar4;
  AssertionResult gtest_ar_3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> img_data;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  AssertHelper local_4a0;
  AssertHelper local_498;
  AssertHelper local_490;
  undefined8 *local_488;
  _Head_base<0UL,_unsigned_char_*,_false> local_480;
  aom_codec_ctx_t local_478;
  undefined1 local_440 [168];
  aom_codec_enc_cfg_t local_398;
  
  local_480._M_head_impl = (uchar *)operator_new__(0x18000);
  local_440._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((internal *)&local_398,"img_data","nullptr",
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_480,
             (void **)local_440);
  if ((char)local_398.g_usage == '\0') {
    testing::Message::Message((Message *)local_440);
    if ((undefined8 *)CONCAT44(local_398.g_w,local_398.g_profile) == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)CONCAT44(local_398.g_w,local_398.g_profile);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_478,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
               ,0xfe,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_478,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_478);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_440._0_8_ + 8))();
    }
    puVar3 = (undefined8 *)CONCAT44(local_398.g_w,local_398.g_profile);
  }
  else {
    puVar3 = (undefined8 *)CONCAT44(local_398.g_w,local_398.g_profile);
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    memset(local_480._M_head_impl,0x80,0x18000);
    iface = aom_codec_av1_cx();
    local_478.name._0_4_ = 0;
    local_490.data_._0_4_ = aom_codec_enc_config_default(iface,&local_398,1);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)local_440,"AOM_CODEC_OK","aom_codec_enc_config_default(iface, &cfg, 1u)",
               (aom_codec_err_t *)&local_478,(aom_codec_err_t *)&local_490);
    if (local_440[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_478);
      if ((undefined8 *)local_440._8_8_ == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = *(SEARCH_METHODS **)local_440._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_490,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x104,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_478);
      testing::internal::AssertHelper::~AssertHelper(&local_490);
      if ((long *)CONCAT44(local_478.name._4_4_,local_478.name._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_478.name._4_4_,local_478.name._0_4_) + 8))();
      }
    }
    uVar1 = local_440._8_8_;
    if ((undefined8 *)local_440._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_440._8_8_ != (undefined8 *)(local_440._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_440._8_8_);
      }
      operator_delete((void *)uVar1);
    }
    local_398.g_w = 0x80;
    local_398.g_h = 0x80;
    local_398.g_forced_max_frame_width = 0xff;
    local_398.g_forced_max_frame_height = 0x100;
    local_490.data_._0_4_ = 0;
    local_4a0.data_._0_4_ = aom_codec_enc_init_ver(&local_478,iface,&local_398,0,0x1d);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)local_440,"AOM_CODEC_OK",
               "aom_codec_enc_init_ver(&enc, iface, &cfg, 0, (10 + (7 + (9)) + 3))",
               (aom_codec_err_t *)&local_490,(aom_codec_err_t *)&local_4a0);
    if (local_440[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_490);
      if ((undefined8 *)local_440._8_8_ == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = *(SEARCH_METHODS **)local_440._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x10a,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_490);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      if ((long *)CONCAT44(local_490.data_._4_4_,(aom_codec_err_t)local_490.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_490.data_._4_4_,(aom_codec_err_t)local_490.data_) + 8))
                  ();
      }
    }
    if ((undefined8 *)local_440._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_440._8_8_ != (undefined8 *)(local_440._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_440._8_8_);
      }
      operator_delete((void *)local_440._8_8_);
    }
    local_4a0.data_ = (AssertHelperData *)local_440;
    local_498.data_ =
         (AssertHelperData *)
         aom_img_wrap((aom_image_t *)local_440,AOM_IMG_FMT_I420,0x80,0x80,1,local_480._M_head_impl);
    testing::internal::CmpHelperEQ<aom_image*,aom_image*>
              ((internal *)&local_490,"&img",
               "aom_img_wrap(&img, AOM_IMG_FMT_I420, 128, 128, 1, img_data.get())",
               (aom_image **)&local_4a0,(aom_image **)&local_498);
    if (local_490.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4a0);
      if (local_488 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_488;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x10e,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_4a0);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      if ((aom_image_t *)local_4a0.data_ != (aom_image_t *)0x0) {
        (**(code **)(*(long *)local_4a0.data_ + 8))();
      }
    }
    puVar3 = local_488;
    if (local_488 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_488 != local_488 + 2) {
        operator_delete((undefined8 *)*local_488);
      }
      operator_delete(puVar3);
    }
    local_4a0.data_ = local_4a0.data_ & 0xffffffff00000000;
    aVar2 = aom_codec_encode(&local_478,(aom_image_t *)local_440,0,1,0);
    local_498.data_._0_4_ = aVar2;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_490,"AOM_CODEC_OK","aom_codec_encode(&enc, &img, 0, 1, 0)",
               (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_498);
    if (local_490.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4a0);
      if (local_488 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_488;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x10f,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_4a0);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      if (local_4a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_4a0.data_ + 8))();
      }
    }
    puVar3 = local_488;
    if (local_488 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_488 != local_488 + 2) {
        operator_delete((undefined8 *)*local_488);
      }
      operator_delete(puVar3);
    }
    local_398.g_w = 0x100;
    local_398.g_h = 0x100;
    local_4a0.data_._0_4_ = 8;
    aVar2 = aom_codec_enc_config_set(&local_478,&local_398);
    local_498.data_._0_4_ = aVar2;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_490,"AOM_CODEC_INVALID_PARAM",
               "aom_codec_enc_config_set(&enc, &cfg)",(aom_codec_err_t *)&local_4a0,
               (aom_codec_err_t *)&local_498);
    if (local_490.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4a0);
      if (local_488 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_488;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x113,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_4a0);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      if (local_4a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_4a0.data_ + 8))();
      }
    }
    puVar3 = local_488;
    if (local_488 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_488 != local_488 + 2) {
        operator_delete((undefined8 *)*local_488);
      }
      operator_delete(puVar3);
    }
    local_4a0.data_ = local_4a0.data_ & 0xffffffff00000000;
    aVar2 = aom_codec_destroy(&local_478);
    local_498.data_._0_4_ = aVar2;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_490,"AOM_CODEC_OK","aom_codec_destroy(&enc)",
               (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_498);
    puVar3 = local_488;
    if (local_490.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4a0);
      if (local_488 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_488;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x115,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_4a0);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      puVar3 = local_488;
      if (local_4a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_4a0.data_ + 8))();
        puVar3 = local_488;
      }
    }
  }
  if (puVar3 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar3 != puVar3 + 2) {
      operator_delete((undefined8 *)*puVar3);
    }
    operator_delete(puVar3);
  }
  if (local_480._M_head_impl != (uchar *)0x0) {
    operator_delete__(local_480._M_head_impl);
  }
  return;
}

Assistant:

TEST(EncodeForcedMaxFrameWidthHeight, SecondFrameTooBig) {
  // A buffer of gray samples. Large enough for 128x128 and 256x256, YUV 4:2:0.
  constexpr size_t kImageDataSize = 256 * 256 + 2 * 128 * 128;
  std::unique_ptr<unsigned char[]> img_data(new unsigned char[kImageDataSize]);
  ASSERT_NE(img_data, nullptr);
  memset(img_data.get(), 128, kImageDataSize);

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_REALTIME));
  cfg.g_w = 128;
  cfg.g_h = 128;
  cfg.g_forced_max_frame_width = 255;
  cfg.g_forced_max_frame_height = 256;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, 0));

  aom_image_t img;
  EXPECT_EQ(&img,
            aom_img_wrap(&img, AOM_IMG_FMT_I420, 128, 128, 1, img_data.get()));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));

  cfg.g_w = 256;
  cfg.g_h = 256;
  EXPECT_EQ(AOM_CODEC_INVALID_PARAM, aom_codec_enc_config_set(&enc, &cfg));

  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}